

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O1

void __thiscall SSD1306::OledI2C::displayUpdate(OledI2C *this)

{
  int __v;
  byte bVar1;
  ssize_t sVar2;
  long *plVar3;
  system_error *this_00;
  int *piVar4;
  error_category *__ecat;
  size_type *psVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  string what;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  lVar8 = 0;
  bVar1 = 0;
  bVar6 = 0;
  do {
    if (*(bool *)((long)(&(this->blocks_)._M_elems[0].bytes_ + 1) + lVar8) == true) {
      sendCommand(this,bVar1 | 0xb0);
      sendCommand(this,'\0');
      sendCommand(this,bVar6 >> 4 | 0x10);
      sVar2 = write((this->fd_).fd_,(this->blocks_)._M_elems[0].bytes_._M_elems + lVar8,0x21);
      if (sVar2 == -1) {
        std::__cxx11::to_string(&local_50,0x15a);
        std::operator+(&local_70,
                       "write /workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/OledI2C.cxx("
                       ,&local_50);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_90._M_dataplus._M_p = (pointer)*plVar3;
        psVar5 = (size_type *)(plVar3 + 2);
        if ((size_type *)local_90._M_dataplus._M_p == psVar5) {
          local_90.field_2._M_allocated_capacity = *psVar5;
          local_90.field_2._8_8_ = plVar3[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar5;
        }
        local_90._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        this_00 = (system_error *)__cxa_allocate_exception(0x20);
        piVar4 = __errno_location();
        __v = *piVar4;
        __ecat = (error_category *)std::_V2::system_category();
        std::system_error::system_error(this_00,__v,__ecat,&local_90);
        __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      *(bool *)((long)(&(this->blocks_)._M_elems[0].bytes_ + 1) + lVar8) = false;
    }
    bVar7 = bVar6 + 0x20;
    bVar6 = bVar7;
    if ((char)bVar7 < '\x01') {
      bVar6 = 0;
    }
    bVar1 = bVar1 - ((char)bVar7 >> 7);
    lVar8 = lVar8 + 0x22;
  } while (lVar8 != 0x440);
  return;
}

Assistant:

void
SSD1306::OledI2C::displayUpdate()
{
    uint8_t page{0};
    uint8_t column{0};

    for (auto& block : blocks_)
    {
        if (block.dirty_)
        {
            uint8_t column_low = column & 0xF;
            uint8_t column_high = (column >> 4) & 0x0F;

            sendCommand(OLED_SET_PAGE_START_ADDRESS_MASK | page);
            sendCommand(OLED_SET_COLUMN_START_LOW_MASK | column_low);
            sendCommand(OLED_SET_COLUMN_START_HIGH_MASK | column_high);

            if (::write(fd_.fd(),
                        block.bytes_.data(),
                        block.bytes_.size()) == -1)
            {
                std::string what( "write " __FILE__ "("
                                + std::to_string(__LINE__)
                                + ")" );
                throw std::system_error(errno,
                                        std::system_category(),
                                        what);
            }

            block.dirty_ = false;
        }

        column += OledI2C::ColumnsPerBlock;

        if (column >= Width)
        {
            column = 0;
            page += 1;
        }
    }
}